

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext_conflict1 *ctx,ImGuiDockNodeSettings *node_settings_array,
               int node_settings_count)

{
  uint uVar1;
  ImGuiID key;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *pIVar3;
  ImGuiDockNode **ppIVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiDockNode *pIVar6;
  ulong uVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  char host_window_title [20];
  char local_48 [24];
  
  if (0 < node_settings_count) {
    uVar7 = 0;
    do {
      if (node_settings_array[uVar7].ID != 0) {
        pIVar2 = DockContextAddNode(ctx,node_settings_array[uVar7].ID);
        if (node_settings_array[uVar7].ParentNodeId == 0) {
          pIVar3 = (ImGuiDockNode *)0x0;
        }
        else {
          pIVar3 = (ImGuiDockNode *)
                   ImGuiStorage::GetVoidPtr
                             (&(ctx->DockContext).Nodes,node_settings_array[uVar7].ParentNodeId);
        }
        pIVar2->ParentNode = pIVar3;
        auVar11 = pshuflw(ZEXT416((uint)node_settings_array[uVar7].Pos),
                          ZEXT416((uint)node_settings_array[uVar7].Pos),0x60);
        IVar8.x = (float)(auVar11._0_4_ >> 0x10);
        IVar8.y = (float)(auVar11._4_4_ >> 0x10);
        pIVar2->Pos = IVar8;
        auVar11 = pshuflw(ZEXT416((uint)node_settings_array[uVar7].Size),
                          ZEXT416((uint)node_settings_array[uVar7].Size),0x60);
        IVar9.x = (float)(auVar11._0_4_ >> 0x10);
        IVar9.y = (float)(auVar11._4_4_ >> 0x10);
        pIVar2->Size = IVar9;
        auVar11 = pshuflw(ZEXT416((uint)node_settings_array[uVar7].SizeRef),
                          ZEXT416((uint)node_settings_array[uVar7].SizeRef),0x60);
        IVar10.x = (float)(auVar11._0_4_ >> 0x10);
        IVar10.y = (float)(auVar11._4_4_ >> 0x10);
        pIVar2->SizeRef = IVar10;
        *(ushort *)&pIVar2->field_0xbc = *(ushort *)&pIVar2->field_0xbc & 0xfe00 | 0x49;
        if (pIVar3 != (ImGuiDockNode *)0x0) {
          if (pIVar3->ChildNodes[0] == (ImGuiDockNode *)0x0) {
            ppIVar4 = pIVar3->ChildNodes;
          }
          else {
            if (pIVar3->ChildNodes[1] != (ImGuiDockNode *)0x0) goto LAB_001dafad;
            ppIVar4 = pIVar3->ChildNodes + 1;
          }
          *ppIVar4 = pIVar2;
        }
LAB_001dafad:
        pIVar2->SelectedTabId = node_settings_array[uVar7].SelectedTabId;
        pIVar2->SplitAxis = (int)node_settings_array[uVar7].SplitAxis;
        uVar1 = node_settings_array[uVar7].Flags & 0xc1fc20;
        pIVar2->LocalFlags = uVar1;
        pIVar2->MergedFlags = pIVar2->SharedFlags | pIVar2->LocalFlagsInWindows | uVar1;
        pIVar3 = pIVar2;
        do {
          pIVar6 = pIVar3;
          pIVar3 = pIVar6->ParentNode;
        } while (pIVar3 != (ImGuiDockNode *)0x0);
        ImFormatString(local_48,0x14,"##DockNode_%02X",(ulong)pIVar6->ID);
        key = ImHashStr(local_48,0,0);
        pIVar5 = (ImGuiWindow_conflict *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
        pIVar2->HostWindow = pIVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)node_settings_count);
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedTabId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->SetLocalFlags(settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}